

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Base64.c
# Opt level: O2

WJTL_STATUS TestBase64Encode(void)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int i;
  JL_STATUS JVar6;
  int iVar7;
  JL_STATUS JVar8;
  int iVar9;
  JL_STATUS JVar10;
  int iVar11;
  JL_STATUS JVar12;
  int iVar13;
  JL_STATUS JVar14;
  int iVar15;
  uint8_t *puVar16;
  uint8_t uVar17;
  long lVar18;
  WJTL_STATUS WVar19;
  char *local_468;
  uint8_t data [3];
  uint8_t data3 [256];
  uint8_t data2 [768];
  
  data[2] = '\x03';
  data[0] = '\x01';
  data[1] = '\x02';
  local_468 = (char *)0x0;
  JVar6 = JlBase64Encode(data,1,&local_468);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 1, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2a);
  pcVar1 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2b);
  iVar7 = strcmp(local_468,"AQ");
  WjTestLib_Assert(iVar7 == 0,"strcmp( string, \"AQ\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2c);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar8 = JlBase64Encode(data,2,&local_468);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 2, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2f);
  pcVar2 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x30);
  iVar9 = strcmp(local_468,"AQI");
  WjTestLib_Assert(iVar9 == 0,"strcmp( string, \"AQI\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x31);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar10 = JlBase64Encode(data,3,&local_468);
  WjTestLib_Assert(JVar10 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 3, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x34);
  pcVar3 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x35);
  iVar11 = strcmp(local_468,"AQID");
  WjTestLib_Assert(iVar11 == 0,"strcmp( string, \"AQID\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x36);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  puVar16 = data2 + 2;
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
    uVar17 = (uint8_t)lVar18;
    puVar16[-2] = uVar17;
    puVar16[-1] = uVar17;
    *puVar16 = uVar17;
    puVar16 = puVar16 + 3;
  }
  JVar12 = JlBase64Encode(data2,0x300,&local_468);
  WjTestLib_Assert(JVar12 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data2, sizeof(data2), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x52);
  pcVar4 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x53);
  iVar13 = strcmp(local_468,
                  "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8PEBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8fICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8vMDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09PUFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19fYGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29vcHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+PkJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+foKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+vsLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////"
                 );
  WjTestLib_Assert(iVar13 == 0,"strcmp( string, data2Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x54);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
    data3[lVar18] = (uint8_t)lVar18;
  }
  JVar14 = JlBase64Encode(data3,0x100,&local_468);
  WjTestLib_Assert(JVar14 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data3, sizeof(data3), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x65);
  pcVar5 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x66);
  iVar15 = strcmp(local_468,
                  "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4vMDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5fYGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6PkJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v8PHy8/T19vf4+fr7/P3+/w"
                 );
  WVar19 = WJTL_STATUS_SUCCESS;
  if (((JVar8 != JL_STATUS_SUCCESS || iVar9 != 0) || (iVar7 != 0 || JVar6 != JL_STATUS_SUCCESS)) ||
      JVar10 != JL_STATUS_SUCCESS) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if (pcVar1 == (char *)0x0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if (pcVar2 == (char *)0x0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if (pcVar3 == (char *)0x0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if ((((JVar12 != JL_STATUS_SUCCESS || iVar11 != 0) || iVar13 != 0) || JVar14 != JL_STATUS_SUCCESS)
      || iVar15 != 0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if (pcVar4 == (char *)0x0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if (pcVar5 == (char *)0x0) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(iVar15 == 0,"strcmp( string, data3Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x67);
  WjTestLib_Free(local_468);
  return WVar19;
}

Assistant:

static
WJTL_STATUS
    TestBase64Encode
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    uint8_t data[] = { 1, 2, 3 };
    char* string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 1, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQ" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 2, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQI" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 3, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQID" ) == 0 );
    JlFree( string );  string = NULL;

    uint8_t data2[256*3];
    for( int i=0; i<256; i++ )
    {
        data2[i*3 + 0] = (uint8_t)i;
        data2[i*3 + 1] = (uint8_t)i;
        data2[i*3 + 2] = (uint8_t)i;
    }
    char const* data2Result =
        "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8P"
        "EBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8f"
        "ICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8v"
        "MDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/"
        "QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09P"
        "UFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19f"
        "YGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29v"
        "cHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/"
        "gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+P"
        "kJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+f"
        "oKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+v"
        "sLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/"
        "wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P"
        "0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f"
        "4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v"
        "8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////";

    JL_ASSERT_SUCCESS( JlBase64Encode( data2, sizeof(data2), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data2Result) == 0 );

    JlFree( string ); string = NULL;

    uint8_t data3[256];
    for( int i=0; i<256; i++ )
    {
        data3[i] = (uint8_t)i;
    }
    char const* data3Result =
        "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4v"
        "MDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5f"
        "YGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6P"
        "kJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/"
        "wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v"
        "8PHy8/T19vf4+fr7/P3+/w";

    JL_ASSERT_SUCCESS( JlBase64Encode( data3, sizeof(data3), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data3Result) == 0 );

    JlFree( string ); string = NULL;

    return TestReturn;
}